

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line_interface_unittest.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::anon_unknown_0::
CommandLineInterfaceTest_ExtensionDeclarationDuplicateNames_Test::
~CommandLineInterfaceTest_ExtensionDeclarationDuplicateNames_Test
          (CommandLineInterfaceTest_ExtensionDeclarationDuplicateNames_Test *this)

{
  CommandLineInterfaceTester::~CommandLineInterfaceTester((CommandLineInterfaceTester *)this);
  operator_delete(this,0x2e8);
  return;
}

Assistant:

TEST_F(CommandLineInterfaceTest, ExtensionDeclarationDuplicateNames) {
  CreateTempFile("foo.proto", R"schema(
    syntax = "proto2";
    package foo;
    message Foo {
      extensions 4000 to max [
        declaration = {
          number: 5000,
          full_name: ".foo.o"
          type: "int32"
        },
        declaration = {
          number: 9000,
          full_name: ".foo.o"
          type: ".foo.Bar"
      }];
    })schema");

  Run("protocol_compiler --test_out=$tmpdir --proto_path=$tmpdir foo.proto");
  ExpectErrorSubstring(
      "Extension field name \".foo.o\" is declared multiple times");
}